

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O3

void __thiscall
so_5::disp::prio_dedicated_threads::one_per_prio::impl::real_private_dispatcher_t::
real_private_dispatcher_t
          (real_private_dispatcher_t *this,environment_t *env,string *data_sources_name_base,
          disp_params_t *params)

{
  _Head_base<0UL,_so_5::disp::prio_dedicated_threads::one_per_prio::impl::proxy_dispatcher_t_*,_false>
  _Var1;
  unique_ptr<so_5::disp::prio_dedicated_threads::one_per_prio::impl::proxy_dispatcher_t,_std::default_delete<so_5::disp::prio_dedicated_threads::one_per_prio::impl::proxy_dispatcher_t>_>
  *this_00;
  
  atomic_refcounted_t::atomic_refcounted_t
            (&(this->super_private_dispatcher_t).super_atomic_refcounted_t);
  (this->super_private_dispatcher_t)._vptr_private_dispatcher_t =
       (_func_int **)&PTR__real_private_dispatcher_t_00289f90;
  this_00 = &this->m_disp;
  stdcpp::
  make_unique<so_5::disp::prio_dedicated_threads::one_per_prio::impl::proxy_dispatcher_t,so_5::disp::prio_dedicated_threads::one_per_prio::disp_params_t>
            ((stdcpp *)this_00,params);
  _Var1._M_head_impl =
       (this_00->_M_t).
       super___uniq_ptr_impl<so_5::disp::prio_dedicated_threads::one_per_prio::impl::proxy_dispatcher_t,_std::default_delete<so_5::disp::prio_dedicated_threads::one_per_prio::impl::proxy_dispatcher_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_so_5::disp::prio_dedicated_threads::one_per_prio::impl::proxy_dispatcher_t_*,_std::default_delete<so_5::disp::prio_dedicated_threads::one_per_prio::impl::proxy_dispatcher_t>_>
       .
       super__Head_base<0UL,_so_5::disp::prio_dedicated_threads::one_per_prio::impl::proxy_dispatcher_t_*,_false>
       ._M_head_impl;
  (**(code **)(*(long *)&(_Var1._M_head_impl)->super_proxy_dispatcher_base_t + 0x28))
            (_Var1._M_head_impl,data_sources_name_base);
  _Var1._M_head_impl =
       (this_00->_M_t).
       super___uniq_ptr_impl<so_5::disp::prio_dedicated_threads::one_per_prio::impl::proxy_dispatcher_t,_std::default_delete<so_5::disp::prio_dedicated_threads::one_per_prio::impl::proxy_dispatcher_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_so_5::disp::prio_dedicated_threads::one_per_prio::impl::proxy_dispatcher_t_*,_std::default_delete<so_5::disp::prio_dedicated_threads::one_per_prio::impl::proxy_dispatcher_t>_>
       .
       super__Head_base<0UL,_so_5::disp::prio_dedicated_threads::one_per_prio::impl::proxy_dispatcher_t_*,_false>
       ._M_head_impl;
  (**(code **)(*(long *)&(_Var1._M_head_impl)->super_proxy_dispatcher_base_t + 0x10))
            (_Var1._M_head_impl,env);
  return;
}

Assistant:

real_private_dispatcher_t(
			//! SObjectizer Environment to work in.
			environment_t & env,
			//! Value for creating names of data sources for
			//! run-time monitoring.
			const std::string & data_sources_name_base,
			//! Parameters for the dispatcher.
			disp_params_t params )
			:	m_disp( so_5::stdcpp::make_unique< proxy_dispatcher_t >(
					std::move( params ) ) )
			{
				m_disp->set_data_sources_name_base( data_sources_name_base );
				m_disp->start( env );
			}